

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O2

amqp_rpc_reply_t *
simple_rpc_inner(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                amqp_channel_t channel,amqp_method_number_t request_id,
                amqp_method_number_t *expected_reply_ids,void *decoded_request_method,
                amqp_time_t deadline)

{
  amqp_channel_t channel_00;
  undefined4 expected;
  int iVar1;
  amqp_pool_t *pool;
  undefined8 *puVar2;
  amqp_link_t *paVar3;
  amqp_link_t *paVar4;
  amqp_frame_t frame;
  
  iVar1 = amqp_send_method(state,channel,request_id,decoded_request_method);
  if (iVar1 < 0) {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar1;
  }
  else {
    while (iVar1 = wait_frame_inner(state,&frame,deadline), expected = frame.payload.method.id,
          channel_00 = frame.channel, iVar1 == 0) {
      if ((frame.frame_type == '\x01') &&
         (((frame.channel == channel &&
           ((iVar1 = amqp_id_in_reply_list(frame.payload.method.id,expected_reply_ids),
            expected == 0x140028 || (iVar1 != 0)))) || (channel_00 == 0 && expected == 0xa0032)))) {
        iVar1 = amqp_id_in_reply_list(expected,expected_reply_ids);
        __return_storage_ptr__->reply_type = (iVar1 == 0) + 1 + (uint)(iVar1 == 0);
        *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
        *(ulong *)&__return_storage_ptr__->reply =
             CONCAT44(frame.payload.body_fragment.len._4_4_,frame.payload.method.id);
        (__return_storage_ptr__->reply).decoded = frame.payload.method.decoded;
        *(undefined8 *)&__return_storage_ptr__->library_error = 0;
        return __return_storage_ptr__;
      }
      pool = amqp_get_or_create_channel_pool(state,channel_00);
      if (pool == (amqp_pool_t *)0x0) {
LAB_0010305d:
        __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
        __return_storage_ptr__->library_error = -1;
        return __return_storage_ptr__;
      }
      puVar2 = (undefined8 *)amqp_pool_alloc(pool,0x30);
      paVar3 = (amqp_link_t *)amqp_pool_alloc(pool,0x10);
      if ((puVar2 == (undefined8 *)0x0) || (paVar3 == (amqp_link_t *)0x0)) goto LAB_0010305d;
      puVar2[4] = frame.payload.properties.raw.len;
      puVar2[5] = frame.payload.properties.raw.bytes;
      puVar2[2] = frame.payload.method.decoded;
      puVar2[3] = frame.payload.properties.decoded;
      *puVar2 = CONCAT44(frame._4_4_,CONCAT22(frame.channel,CONCAT11(frame._1_1_,frame.frame_type)))
      ;
      puVar2[1] = CONCAT44(frame.payload.body_fragment.len._4_4_,frame.payload.method.id);
      paVar3->next = (amqp_link_t_ *)0x0;
      paVar3->data = puVar2;
      paVar4 = state->last_queued_frame;
      if (state->last_queued_frame == (amqp_link_t *)0x0) {
        paVar4 = (amqp_link_t *)&state->first_queued_frame;
      }
      paVar4->next = paVar3;
      state->last_queued_frame = paVar3;
    }
    if (iVar1 == -0xd) {
      (*state->socket->klass->close)(state->socket,AMQP_SC_FORCE);
    }
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static amqp_rpc_reply_t simple_rpc_inner(
    amqp_connection_state_t state, amqp_channel_t channel,
    amqp_method_number_t request_id, amqp_method_number_t *expected_reply_ids,
    void *decoded_request_method, amqp_time_t deadline) {
  int status;
  amqp_rpc_reply_t result;

  memset(&result, 0, sizeof(result));

  status = amqp_send_method(state, channel, request_id, decoded_request_method);
  if (status < 0) {
    return amqp_rpc_reply_error(status);
  }

  {
    amqp_frame_t frame;

  retry:
    status = wait_frame_inner(state, &frame, deadline);
    if (status != AMQP_STATUS_OK) {
      if (status == AMQP_STATUS_TIMEOUT) {
        amqp_socket_close(state->socket, AMQP_SC_FORCE);
      }
      return amqp_rpc_reply_error(status);
    }

    /*
     * We store the frame for later processing unless it's something
     * that directly affects us here, namely a method frame that is
     * either
     *  - on the channel we want, and of the expected type, or
     *  - on the channel we want, and a channel.close frame, or
     *  - on channel zero, and a connection.close frame.
     */
    if (!((frame.frame_type == AMQP_FRAME_METHOD) &&
          (((frame.channel == channel) &&
            (amqp_id_in_reply_list(frame.payload.method.id,
                                   expected_reply_ids) ||
             (frame.payload.method.id == AMQP_CHANNEL_CLOSE_METHOD))) ||
           ((frame.channel == 0) &&
            (frame.payload.method.id == AMQP_CONNECTION_CLOSE_METHOD))))) {
      amqp_pool_t *channel_pool;
      amqp_frame_t *frame_copy;
      amqp_link_t *link;

      channel_pool = amqp_get_or_create_channel_pool(state, frame.channel);
      if (NULL == channel_pool) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      frame_copy = amqp_pool_alloc(channel_pool, sizeof(amqp_frame_t));
      link = amqp_pool_alloc(channel_pool, sizeof(amqp_link_t));

      if (frame_copy == NULL || link == NULL) {
        return amqp_rpc_reply_error(AMQP_STATUS_NO_MEMORY);
      }

      *frame_copy = frame;

      link->next = NULL;
      link->data = frame_copy;

      if (state->last_queued_frame == NULL) {
        state->first_queued_frame = link;
      } else {
        state->last_queued_frame->next = link;
      }
      state->last_queued_frame = link;

      goto retry;
    }

    result.reply_type =
        (amqp_id_in_reply_list(frame.payload.method.id, expected_reply_ids))
            ? AMQP_RESPONSE_NORMAL
            : AMQP_RESPONSE_SERVER_EXCEPTION;

    result.reply = frame.payload.method;
    return result;
  }
}